

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O1

void pbrt::ComputeBeamDiffusionBSSRDF(Float g,Float eta,BSSRDFTable *t)

{
  uint *puVar1;
  float fVar2;
  undefined8 *puVar3;
  long end;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined8 uVar52;
  undefined8 uVar53;
  byte bVar54;
  ulong uVar55;
  ulong uVar56;
  long in_RDI;
  ushort uVar57;
  ulong uVar58;
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 in_ZMM2 [64];
  undefined1 local_68 [4];
  undefined1 local_64 [4];
  undefined1 local_60 [8];
  long *local_58;
  undefined8 uStack_50;
  code *pcStack_48;
  code *pcStack_40;
  _Any_data local_38;
  code *pcStack_28;
  code *pcStack_20;
  
  puVar3 = *(undefined8 **)(in_RDI + 0x28);
  *puVar3 = 0x3b23d70a00000000;
  uVar56 = *(ulong *)(in_RDI + 0x38);
  if (2 < uVar56) {
    fVar2 = *(float *)((long)puVar3 + 4);
    uVar55 = 2;
    do {
      fVar2 = fVar2 * 1.2;
      *(float *)((long)puVar3 + uVar55 * 4) = fVar2;
      uVar55 = uVar55 + 1;
    } while (uVar56 != uVar55);
  }
  end = *(long *)(in_RDI + 0x18);
  if (end != 0) {
    lVar4 = *(long *)(in_RDI + 8);
    auVar51 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,end + -1);
    auVar59 = vpbroadcastq_avx512f();
    auVar60 = vbroadcastss_avx512f(auVar51);
    auVar61 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar62 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar63 = vpmovsxbd_avx512f(_DAT_0045b6f0);
    auVar64 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
    auVar65 = vbroadcastss_avx512f(ZEXT416(0x3da00ac9));
    auVar66 = vbroadcastss_avx512f(ZEXT416(0x3e679a0b));
    auVar67 = vbroadcastss_avx512f(ZEXT416(0x3f321004));
    auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    uVar56 = 0;
    auVar69 = vpbroadcastd_avx512f(ZEXT416(0xffffff81));
    auVar70 = vpbroadcastd_avx512f(ZEXT416(0x3f800000));
    auVar71 = vpbroadcastd_avx512f(ZEXT416(0x807fffff));
    auVar72 = vpbroadcastd_avx512f(ZEXT416(0xffffff82));
    auVar73 = vpbroadcastd_avx512f(ZEXT416(0x7f));
    auVar74 = vbroadcastss_avx512f(ZEXT416(0x3f7fea04));
    auVar75 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar76 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      auVar77 = vpslld_avx512f(auVar63,3);
      auVar77 = vpsubd_avx512f(ZEXT1664((undefined1  [16])0x0),auVar77);
      uVar52 = vpcmpuq_avx512f(auVar62,auVar59,2);
      auVar77 = vcvtdq2ps_avx512f(auVar77);
      auVar77 = vdivps_avx512f(auVar77,auVar60);
      auVar77 = vmulps_avx512f(auVar77,auVar64);
      auVar78 = vrndscaleps_avx512f(auVar77,9);
      uVar53 = vpcmpuq_avx512f(auVar61,auVar59,2);
      bVar54 = (byte)uVar53;
      auVar77 = vsubps_avx512f(auVar77,auVar78);
      auVar79 = vfmadd213ps_avx512f(auVar65,auVar77,auVar66);
      auVar79 = vfmadd213ps_avx512f(auVar79,auVar77,auVar67);
      auVar78 = vcvttps2dq_avx512f(auVar78);
      auVar77 = vfmadd213ps_avx512f(auVar79,auVar77,auVar68);
      auVar79 = vpsrld_avx512f(auVar77,0x17);
      auVar78 = vpaddd_avx512f(auVar78,auVar79);
      auVar78 = vpaddd_avx512f(auVar78,auVar69);
      auVar79 = vpslld_avx512f(auVar78,0x17);
      uVar57 = CONCAT11(bVar54,(byte)uVar52);
      auVar79 = vpaddd_avx512f(auVar79,auVar70);
      auVar77 = vpternlogd_avx512f(auVar79,auVar77,auVar71,0xf8);
      uVar58 = vpcmpd_avx512f(auVar78,auVar72,1);
      uVar58 = uVar57 & uVar58;
      auVar77 = vsubps_avx512f(auVar68,auVar77);
      auVar77 = vdivps_avx512f(auVar77,auVar74);
      uVar55 = vpcmpgtd_avx512f(auVar78,auVar73);
      uVar55 = uVar57 & uVar55;
      auVar78 = vbroadcastss_avx512f(ZEXT416(0x3f800aff));
      bVar5 = (bool)((byte)uVar58 & 1);
      bVar8 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar58 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar58 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar58 >> 4) & 1);
      bVar20 = (bool)((byte)(uVar58 >> 5) & 1);
      bVar23 = (bool)((byte)(uVar58 >> 6) & 1);
      bVar26 = (bool)((byte)(uVar58 >> 7) & 1);
      bVar29 = (bool)((byte)(uVar58 >> 8) & 1);
      bVar31 = (bool)((byte)(uVar58 >> 9) & 1);
      bVar34 = (bool)((byte)(uVar58 >> 10) & 1);
      bVar37 = (bool)((byte)(uVar58 >> 0xb) & 1);
      bVar40 = (bool)((byte)(uVar58 >> 0xc) & 1);
      bVar43 = (bool)((byte)(uVar58 >> 0xd) & 1);
      bVar46 = (bool)((byte)(uVar58 >> 0xe) & 1);
      bVar49 = SUB81(uVar58 >> 0xf,0);
      auVar79 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar6 = (bool)((byte)uVar55 & 1);
      bVar9 = (bool)((byte)(uVar55 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar55 >> 4) & 1);
      bVar21 = (bool)((byte)(uVar55 >> 5) & 1);
      bVar24 = (bool)((byte)(uVar55 >> 6) & 1);
      bVar27 = (bool)((byte)(uVar55 >> 7) & 1);
      bVar30 = (bool)((byte)(uVar55 >> 8) & 1);
      bVar32 = (bool)((byte)(uVar55 >> 9) & 1);
      bVar35 = (bool)((byte)(uVar55 >> 10) & 1);
      bVar38 = (bool)((byte)(uVar55 >> 0xb) & 1);
      bVar41 = (bool)((byte)(uVar55 >> 0xc) & 1);
      bVar44 = (bool)((byte)(uVar55 >> 0xd) & 1);
      bVar47 = (bool)((byte)(uVar55 >> 0xe) & 1);
      bVar50 = SUB81(uVar55 >> 0xf,0);
      puVar1 = (uint *)(lVar4 + uVar56 * 4);
      bVar7 = (bool)((byte)uVar52 & 1);
      bVar10 = (bool)((byte)(uVar57 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar57 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar57 >> 3) & 1);
      bVar19 = (bool)((byte)(uVar57 >> 4) & 1);
      bVar22 = (bool)((byte)(uVar57 >> 5) & 1);
      bVar25 = (bool)((byte)(uVar57 >> 6) & 1);
      bVar28 = (bool)((byte)(uVar57 >> 7) & 1);
      bVar33 = (bool)(bVar54 >> 1 & 1);
      bVar36 = (bool)(bVar54 >> 2 & 1);
      bVar39 = (bool)(bVar54 >> 3 & 1);
      bVar42 = (bool)(bVar54 >> 4 & 1);
      bVar45 = (bool)(bVar54 >> 5 & 1);
      bVar48 = (bool)(bVar54 >> 6 & 1);
      *puVar1 = (uint)bVar7 *
                ((uint)bVar6 * auVar79._0_4_ |
                (uint)!bVar6 * ((uint)bVar5 * auVar78._0_4_ | (uint)!bVar5 * auVar77._0_4_)) |
                (uint)!bVar7 * *puVar1;
      puVar1[1] = (uint)bVar10 *
                  ((uint)bVar9 * auVar79._4_4_ |
                  (uint)!bVar9 * ((uint)bVar8 * auVar78._4_4_ | (uint)!bVar8 * auVar77._4_4_)) |
                  (uint)!bVar10 * puVar1[1];
      puVar1[2] = (uint)bVar13 *
                  ((uint)bVar12 * auVar79._8_4_ |
                  (uint)!bVar12 * ((uint)bVar11 * auVar78._8_4_ | (uint)!bVar11 * auVar77._8_4_)) |
                  (uint)!bVar13 * puVar1[2];
      puVar1[3] = (uint)bVar16 *
                  ((uint)bVar15 * auVar79._12_4_ |
                  (uint)!bVar15 * ((uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar77._12_4_))
                  | (uint)!bVar16 * puVar1[3];
      puVar1[4] = (uint)bVar19 *
                  ((uint)bVar18 * auVar79._16_4_ |
                  (uint)!bVar18 * ((uint)bVar17 * auVar78._16_4_ | (uint)!bVar17 * auVar77._16_4_))
                  | (uint)!bVar19 * puVar1[4];
      puVar1[5] = (uint)bVar22 *
                  ((uint)bVar21 * auVar79._20_4_ |
                  (uint)!bVar21 * ((uint)bVar20 * auVar78._20_4_ | (uint)!bVar20 * auVar77._20_4_))
                  | (uint)!bVar22 * puVar1[5];
      puVar1[6] = (uint)bVar25 *
                  ((uint)bVar24 * auVar79._24_4_ |
                  (uint)!bVar24 * ((uint)bVar23 * auVar78._24_4_ | (uint)!bVar23 * auVar77._24_4_))
                  | (uint)!bVar25 * puVar1[6];
      puVar1[7] = (uint)bVar28 *
                  ((uint)bVar27 * auVar79._28_4_ |
                  (uint)!bVar27 * ((uint)bVar26 * auVar78._28_4_ | (uint)!bVar26 * auVar77._28_4_))
                  | (uint)!bVar28 * puVar1[7];
      puVar1[8] = (uint)(bVar54 & 1) *
                  ((uint)bVar30 * auVar79._32_4_ |
                  (uint)!bVar30 * ((uint)bVar29 * auVar78._32_4_ | (uint)!bVar29 * auVar77._32_4_))
                  | (uint)!(bool)(bVar54 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar33 *
                  ((uint)bVar32 * auVar79._36_4_ |
                  (uint)!bVar32 * ((uint)bVar31 * auVar78._36_4_ | (uint)!bVar31 * auVar77._36_4_))
                  | (uint)!bVar33 * puVar1[9];
      puVar1[10] = (uint)bVar36 *
                   ((uint)bVar35 * auVar79._40_4_ |
                   (uint)!bVar35 * ((uint)bVar34 * auVar78._40_4_ | (uint)!bVar34 * auVar77._40_4_))
                   | (uint)!bVar36 * puVar1[10];
      puVar1[0xb] = (uint)bVar39 *
                    ((uint)bVar38 * auVar79._44_4_ |
                    (uint)!bVar38 * ((uint)bVar37 * auVar78._44_4_ | (uint)!bVar37 * auVar77._44_4_)
                    ) | (uint)!bVar39 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar42 *
                    ((uint)bVar41 * auVar79._48_4_ |
                    (uint)!bVar41 * ((uint)bVar40 * auVar78._48_4_ | (uint)!bVar40 * auVar77._48_4_)
                    ) | (uint)!bVar42 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar45 *
                    ((uint)bVar44 * auVar79._52_4_ |
                    (uint)!bVar44 * ((uint)bVar43 * auVar78._52_4_ | (uint)!bVar43 * auVar77._52_4_)
                    ) | (uint)!bVar45 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar48 *
                    ((uint)bVar47 * auVar79._56_4_ |
                    (uint)!bVar47 * ((uint)bVar46 * auVar78._56_4_ | (uint)!bVar46 * auVar77._56_4_)
                    ) | (uint)!bVar48 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar54 >> 7) *
                    ((uint)bVar50 * auVar79._60_4_ |
                    (uint)!bVar50 * ((uint)bVar49 * auVar78._60_4_ | (uint)!bVar49 * auVar77._60_4_)
                    ) | (uint)!(bool)(bVar54 >> 7) * puVar1[0xf];
      uVar56 = uVar56 + 0x10;
      auVar62 = vpaddq_avx512f(auVar62,auVar75);
      auVar61 = vpaddq_avx512f(auVar61,auVar75);
      auVar63 = vpaddd_avx512f(auVar63,auVar76);
    } while ((end + 0xfU & 0xfffffffffffffff0) != uVar56);
  }
  local_58 = (long *)0x0;
  uStack_50 = 0;
  pcStack_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (long *)operator_new(0x18);
  *local_58 = (long)local_60;
  local_58[1] = (long)local_64;
  local_58[2] = (long)local_68;
  pcStack_40 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.cpp:111:42)>
               ::_M_invoke;
  pcStack_48 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.cpp:111:42)>
               ::_M_manager;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
               ::_M_invoke;
  pcStack_28 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
               ::_M_manager;
  local_38._M_unused._M_object = &local_58;
  ParallelFor(0,end,(function<void_(long,_long)> *)&local_38);
  if (pcStack_28 != (code *)0x0) {
    (*pcStack_28)(&local_38,&local_38,__destroy_functor);
  }
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] =
            (1 - FastExp(-8 * i / (Float)(t->rhoSamples.size() - 1))) / (1 - FastExp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] = IntegrateCatmullRom(
            t->radiusSamples,
            pstd::span<const Float>(&t->profile[i * nSamples], nSamples),
            pstd::span<Float>(&t->profileCDF[i * nSamples], nSamples));
    });
}